

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

void sg_init_shader(sg_shader shd_id,sg_shader_desc *desc)

{
  _sg_shader_t *shd;
  sg_shader_desc desc_def;
  sg_shader_desc local_bf0;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e16,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
  }
  _sg_shader_desc_defaults(&local_bf0,desc);
  shd = _sg_lookup_shader((_sg_pools_t *)(ulong)shd_id.id,(uint32_t)desc);
  if (shd != (_sg_shader_t *)0x0) {
    if ((shd->slot).state != SG_RESOURCESTATE_ALLOC) {
      _sg_log("sg_init_shader: shader must be in alloc state\n");
      return;
    }
    _sg_init_shader(shd,&local_bf0);
    if (((shd->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(shd->slot.state == SG_RESOURCESTATE_VALID) || (shd->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3e1c,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
    }
  }
  return;
}

Assistant:

inline void sg_init_shader(sg_shader shd_id, const sg_shader_desc& desc) { return sg_init_shader(shd_id, &desc); }